

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O2

NullableValue<kj::Exception> * __thiscall
kj::_::NullableValue<kj::Exception>::operator=
          (NullableValue<kj::Exception> *this,NullableValue<kj::Exception> *other)

{
  if (other != this) {
    if (this->isSet == true) {
      this->isSet = false;
      Exception::~Exception(&(this->field_1).value);
    }
    if (other->isSet == true) {
      Exception::Exception(&(this->field_1).value,&(other->field_1).value);
      this->isSet = true;
    }
  }
  return this;
}

Assistant:

inline NullableValue& operator=(NullableValue&& other) {
    if (&other != this) {
      // Careful about throwing destructors/constructors here.
      if (isSet) {
        isSet = false;
        dtor(value);
      }
      if (other.isSet) {
        ctor(value, kj::mv(other.value));
        isSet = true;
      }
    }
    return *this;
  }